

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnum
          (DescriptorBuilder *this,EnumDescriptorProto *proto,Descriptor *parent,
          EnumDescriptor *result,FlatAllocator *alloc)

{
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *this_01;
  byte bVar1;
  PointerT<char> pcVar2;
  ushort *puVar3;
  anon_union_8_1_a8a14541_for_iterator_2 args;
  size_t sVar4;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  RepeatedPtrFieldBase *this_02;
  bool bVar5;
  undefined8 *puVar6;
  DescriptorNames DVar7;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar8;
  EnumValueDescriptor *pEVar9;
  Nullable<const_char_*> failure_msg;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>_>
  *pVVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar11;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *in;
  string *psVar12;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>_>
  *pVVar13;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>_>
  *descriptor;
  void **ppvVar14;
  const_iterator cVar15;
  ReservedRange *pRVar16;
  char *pcVar17;
  int iVar18;
  int j;
  int iVar19;
  int i;
  ulong uVar20;
  long lVar21;
  int i_2;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  Descriptor *pDVar25;
  string_view scope;
  string_view name;
  string_view element_name;
  string_view full_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  string_view proto_name;
  string_view full_name_00;
  string_view option_name;
  string_view name_00;
  EnumValueDescriptor *value;
  RepeatedPtrFieldBase *local_d0;
  Descriptor *local_c8;
  uint local_bc;
  anon_union_8_1_a8a14541_for_iterator_2 local_b8;
  pointer local_b0;
  char local_a8;
  RepeatedPtrFieldBase *local_a0;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  reserved_name_set;
  
  if (parent == (Descriptor *)0x0) {
    psVar12 = this->file_->package_;
    pcVar17 = (psVar12->_M_dataplus)._M_p;
    uVar20 = psVar12->_M_string_length;
  }
  else {
    pcVar17 = (parent->all_names_).payload_;
    uVar20 = (ulong)*(ushort *)(pcVar17 + 2);
    pcVar17 = pcVar17 + ~uVar20;
  }
  puVar6 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  scope._M_str = pcVar17;
  scope._M_len = uVar20;
  proto_name._M_str = (char *)*puVar6;
  proto_name._M_len = puVar6[1];
  DVar7 = AllocateNameStrings(this,scope,proto_name,&proto->super_Message,alloc);
  (result->all_names_).payload_ = DVar7.payload_;
  puVar6 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  full_name_00._M_len = (ulong)*(ushort *)(DVar7.payload_ + 2);
  full_name_00._M_str = (FlatAllocator *)(DVar7.payload_ + ~full_name_00._M_len);
  name._M_str = (char *)*puVar6;
  name._M_len = puVar6[1];
  ValidateSymbolName(this,name,full_name_00,&proto->super_Message);
  result->file_ = this->file_;
  result->containing_type_ = parent;
  bVar1 = result->field_0x1;
  result->field_0x1 = bVar1 & 0xfc;
  result->field_0x1 = bVar1 & 0xf0 | (*(byte *)((long)&proto->field_0 + 0x60) & 3) << 2;
  local_c8 = parent;
  if (*(int *)((long)&proto->field_0 + 0x10) == 0) {
    pcVar17 = (result->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar17 + 2);
    element_name._M_str = pcVar17 + ~element_name._M_len;
    full_name_00._M_str = (FlatAllocator *)0x0;
    AddError(this,element_name,&proto->super_Message,NAME,"Enums must contain at least one value.");
  }
  this_00 = &(proto->field_0)._impl_.value_;
  uVar20 = 0;
  local_d0 = &this_00->super_RepeatedPtrFieldBase;
  while( true ) {
    iVar18 = *(int *)((long)&proto->field_0 + 0x10);
    if ((0xfffe < uVar20) || ((long)iVar18 <= (long)uVar20)) goto LAB_00139874;
    pVVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                       (&this_00->super_RepeatedPtrFieldBase,(int)uVar20);
    iVar18 = (pVVar8->field_0)._impl_.number_;
    pVVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                       (&this_00->super_RepeatedPtrFieldBase,0);
    if ((long)(pVVar8->field_0)._impl_.number_ + uVar20 != (long)iVar18) break;
    result->sequential_value_limit_ = (int16_t)uVar20;
    uVar20 = uVar20 + 1;
  }
  iVar18 = *(int *)((long)&proto->field_0 + 0x10);
LAB_00139874:
  result->value_count_ = iVar18;
  pEVar9 = anon_unknown_24::
           FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::AllocateArray<google::protobuf::EnumValueDescriptor>
                     (&alloc->
                       super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                      ,iVar18);
  result->values_ = pEVar9;
  lVar23 = 0;
  for (lVar21 = 0; lVar21 < *(int *)((long)&proto->field_0 + 0x10); lVar21 = lVar21 + 1) {
    pVVar8 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                       (local_d0,(int)lVar21);
    full_name_00._M_str = alloc;
    BuildEnumValue(this,pVVar8,result,
                   (EnumValueDescriptor *)(&result->values_->super_SymbolBaseN<0> + lVar23),alloc);
    lVar23 = lVar23 + 0x30;
  }
  iVar18 = *(int *)((long)&proto->field_0 + 0x28);
  result->reserved_range_count_ = iVar18;
  pcVar2 = (alloc->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<char>.value;
  if (pcVar2 == (PointerT<char>)0x0) {
    failure_msg = "has_allocated()";
    iVar18 = 0x1b0;
  }
  else {
    iVar19 = (alloc->
             super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ).used_.payload_.super_Base<char>.value;
    iVar18 = iVar19 + iVar18 * 8;
    (alloc->
    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ).used_.payload_.super_Base<char>.value = iVar18;
    failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                            (iVar18,(alloc->
                                    super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                                    ).total_.payload_.super_Base<char>.value,
                             "used <= total_.template Get<TypeToUse>()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      result->reserved_ranges_ = (ReservedRange *)(pcVar2 + iVar19);
      this_01 = &(proto->field_0)._impl_.reserved_range_;
      lVar23 = 0;
      for (lVar21 = 0; lVar21 < *(int *)((long)&proto->field_0 + 0x28); lVar21 = lVar21 + 1) {
        pVVar10 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                            (&this_01->super_RepeatedPtrFieldBase,(int)lVar21);
        BuildReservedRange(this,pVVar10,result,
                           (ReservedRange *)((long)&result->reserved_ranges_->start + lVar23),
                           full_name_00._M_str);
        lVar23 = lVar23 + 8;
      }
      uVar22 = *(uint *)((long)&proto->field_0 + 0x40);
      result->reserved_name_count_ = uVar22;
      ppbVar11 = (anonymous_namespace)::
                 FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                 ::AllocateArray<std::__cxx11::string_const*>
                           ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                             *)alloc,uVar22);
      result->reserved_names_ = ppbVar11;
      local_a0 = &(proto->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase;
      uVar24 = 0;
      uVar20 = (ulong)uVar22;
      if ((int)uVar22 < 1) {
        uVar20 = uVar24;
      }
      for (; uVar20 != uVar24; uVar24 = uVar24 + 1) {
        in = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                       (local_a0,(int)uVar24);
        psVar12 = (anonymous_namespace)::
                  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                  ::AllocateStrings<std::__cxx11::string_const&>
                            ((FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
                              *)alloc,in);
        result->reserved_names_[uVar24] = psVar12;
      }
      option_name._M_str = "google.protobuf.EnumOptions";
      option_name._M_len = 0x1b;
      AllocateOptions<google::protobuf::EnumDescriptor>(this,proto,result,3,option_name,alloc);
      puVar3 = (ushort *)(result->all_names_).payload_;
      full_name._M_len = (ulong)puVar3[1];
      full_name._M_str = (char *)((long)puVar3 + ~full_name._M_len);
      name_00._M_len = (ulong)*puVar3;
      name_00._M_str = (char *)((long)puVar3 + ~name_00._M_len);
      (result->super_SymbolBase).symbol_type_ = '\x04';
      AddSymbol(this,full_name,local_c8,name_00,&proto->super_Message,(Symbol)result);
      iVar18 = *(int *)((long)&proto->field_0 + 0x28);
      pDVar25 = (Descriptor *)0x0;
      while (this_02 = local_a0, iVar19 = (int)pDVar25, iVar19 < iVar18) {
        pVVar10 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                            (&this_01->super_RepeatedPtrFieldBase,iVar19);
        uVar22 = iVar19 + 1;
        local_c8 = pDVar25;
        local_bc = uVar22;
        for (; iVar18 = *(int *)((long)&proto->field_0 + 0x28), (int)uVar22 < iVar18;
            uVar22 = uVar22 + 1) {
          pVVar13 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                              (&this_01->super_RepeatedPtrFieldBase,uVar22);
          if (((pVVar13->field_0)._impl_.start_ <= (pVVar10->field_0)._impl_.end_) &&
             ((pVVar10->field_0)._impl_.start_ <= (pVVar13->field_0)._impl_.end_)) {
            pcVar17 = (result->all_names_).payload_;
            uVar20 = (ulong)*(ushort *)(pcVar17 + 2);
            descriptor = internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                                   (&this_01->super_RepeatedPtrFieldBase,(int)local_c8);
            make_error.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
            ;
            make_error.ptr_.obj = &reserved_name_set;
            element_name_00._M_str = pcVar17 + ~uVar20;
            element_name_00._M_len = uVar20;
            reserved_name_set.
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_ = (size_t)pVVar13;
            reserved_name_set.
            super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            .settings_.
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            size_ = (size_t)pVVar10;
            AddError(this,element_name_00,&descriptor->super_Message,NUMBER,make_error);
          }
        }
        pDVar25 = (Descriptor *)(ulong)local_bc;
      }
      reserved_name_set.
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ = 1;
      reserved_name_set.
      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .settings_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ =
           0;
      ppvVar14 = internal::RepeatedPtrFieldBase::elements(local_a0);
      cVar15 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::end((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this_02);
      for (; ppvVar14 != cVar15.it_; ppvVar14 = ppvVar14 + 1) {
        args.slot_ = (slot_type *)*ppvVar14;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::
        emplace<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                  ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
                    *)&local_b8,
                   &reserved_name_set.
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args.slot_)
        ;
        if (local_a8 == '\0') {
          make_error_00.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__1,std::__cxx11::string>
          ;
          make_error_00.ptr_.obj = &local_b8;
          element_name_01._M_str = ((_Alloc_hider *)&(args.slot_)->_M_len)->_M_p;
          element_name_01._M_len = (size_t)(args.slot_)->_M_str;
          local_b8.slot_ = args.slot_;
          AddError(this,element_name_01,&proto->super_Message,NAME,make_error_00);
        }
      }
      for (iVar18 = 0; iVar18 < result->value_count_; iVar18 = iVar18 + 1) {
        value = EnumDescriptor::value(result,iVar18);
        for (iVar19 = 0; iVar19 < result->reserved_range_count_; iVar19 = iVar19 + 1) {
          pRVar16 = EnumDescriptor::reserved_range(result,iVar19);
          if ((pRVar16->start <= value->number_) && (value->number_ <= pRVar16->end)) {
            pcVar17 = value->all_names_[1]._M_dataplus._M_p;
            sVar4 = value->all_names_[1]._M_string_length;
            pVVar10 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto_EnumReservedRange>>
                                (&this_01->super_RepeatedPtrFieldBase,iVar19);
            make_error_01.invoker_ =
                 absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__2,std::__cxx11::string>
            ;
            make_error_01.ptr_.obj = &local_b8;
            element_name_02._M_str = pcVar17;
            element_name_02._M_len = sVar4;
            local_b8.slot_ = (slot_type *)&value;
            AddError(this,element_name_02,&pVVar10->super_Message,NUMBER,make_error_01);
          }
        }
        local_b0 = (value->all_names_->_M_dataplus)._M_p;
        local_b8 = (anon_union_8_1_a8a14541_for_iterator_2)value->all_names_->_M_string_length;
        bVar5 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::contains<std::basic_string_view<char,std::char_traits<char>>>
                          ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                            *)&reserved_name_set,(key_arg<std::basic_string_view<char>_> *)&local_b8
                          );
        if (bVar5) {
          pcVar17 = value->all_names_[1]._M_dataplus._M_p;
          sVar4 = value->all_names_[1]._M_string_length;
          pVVar8 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                             (local_d0,iVar18);
          make_error_02.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::BuildEnum(google::protobuf::EnumDescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::EnumDescriptor*,google::protobuf::internal::FlatAllocator&)::__3,std::__cxx11::string>
          ;
          make_error_02.ptr_.obj = &local_b8;
          element_name_03._M_str = pcVar17;
          element_name_03._M_len = sVar4;
          local_b8.slot_ = (slot_type *)&value;
          AddError(this,element_name_03,&pVVar8->super_Message,NAME,make_error_02);
        }
      }
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~raw_hash_set(&reserved_name_set.
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     );
      return;
    }
    iVar18 = 0x1b6;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&reserved_name_set,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,iVar18,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)&reserved_name_set);
}

Assistant:

void DescriptorBuilder::BuildEnum(const EnumDescriptorProto& proto,
                                  const Descriptor* parent,
                                  EnumDescriptor* result,
                                  internal::FlatAllocator& alloc) {
  const absl::string_view scope =
      (parent == nullptr) ? file_->package() : parent->full_name();

  result->all_names_ = AllocateNameStrings(scope, proto.name(), proto, alloc);
  ValidateSymbolName(proto.name(), result->full_name(), proto);
  result->file_ = file_;
  result->containing_type_ = parent;
  result->is_placeholder_ = false;
  result->is_unqualified_placeholder_ = false;
  result->visibility_ = static_cast<uint8_t>(proto.visibility());

  if (proto.value_size() == 0) {
    // We cannot allow enums with no values because this would mean there
    // would be no valid default value for fields of this type.
    AddError(result->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
             "Enums must contain at least one value.");
  }

  // Calculate the continuous sequence of the labels.
  // These can be fast-path'd during lookup and don't need to be added to the
  // tables.
  // We use uint16_t to save space for sequential_value_limit_, so stop before
  // overflowing it. Worst case, we are not taking full advantage on huge
  // enums, but it is unlikely.
  for (int i = 0;
       i < std::numeric_limits<uint16_t>::max() && i < proto.value_size() &&
       // We do the math in int64_t to avoid overflows.
       proto.value(i).number() ==
           static_cast<int64_t>(i) + proto.value(0).number();
       ++i) {
    result->sequential_value_limit_ = i;
  }

  BUILD_ARRAY(proto, result, value, BuildEnumValue, result);
  BUILD_ARRAY(proto, result, reserved_range, BuildReservedRange, result);

  // Copy reserved names.
  int reserved_name_count = proto.reserved_name_size();
  result->reserved_name_count_ = reserved_name_count;
  result->reserved_names_ =
      alloc.AllocateArray<const std::string*>(reserved_name_count);
  for (int i = 0; i < reserved_name_count; ++i) {
    result->reserved_names_[i] = alloc.AllocateStrings(proto.reserved_name(i));
  }

  // Copy options.
  AllocateOptions(proto, result, EnumDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.EnumOptions", alloc);

  AddSymbol(result->full_name(), parent, result->name(), proto, Symbol(result));

  for (int i = 0; i < proto.reserved_range_size(); i++) {
    const EnumDescriptorProto_EnumReservedRange& range1 =
        proto.reserved_range(i);
    for (int j = i + 1; j < proto.reserved_range_size(); j++) {
      const EnumDescriptorProto_EnumReservedRange& range2 =
          proto.reserved_range(j);
      if (range1.end() >= range2.start() && range2.end() >= range1.start()) {
        AddError(result->full_name(), proto.reserved_range(i),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Reserved range $0 to $1 overlaps with "
                       "already-defined range $2 to $3.",
                       range2.start(), range2.end(), range1.start(),
                       range1.end());
                 });
      }
    }
  }

  absl::flat_hash_set<absl::string_view> reserved_name_set;
  for (const std::string& name : proto.reserved_name()) {
    if (!reserved_name_set.insert(name).second) {
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
        return absl::Substitute("Enum value \"$0\" is reserved multiple times.",
                                name);
      });
    }
  }

  for (int i = 0; i < result->value_count(); i++) {
    const EnumValueDescriptor* value = result->value(i);
    for (int j = 0; j < result->reserved_range_count(); j++) {
      const EnumDescriptor::ReservedRange* range = result->reserved_range(j);
      if (range->start <= value->number() && value->number() <= range->end) {
        AddError(value->full_name(), proto.reserved_range(j),
                 DescriptorPool::ErrorCollector::NUMBER, [&] {
                   return absl::Substitute(
                       "Enum value \"$0\" uses reserved number $1.",
                       value->name(), value->number());
                 });
      }
    }
    if (reserved_name_set.contains(value->name())) {
      AddError(value->full_name(), proto.value(i),
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::Substitute("Enum value \"$0\" is reserved.",
                                         value->name());
               });
    }
  }
}